

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswread.c
# Opt level: O1

int32_t conv_mcnp6_pdg2ssw(int32_t c)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  int32_t *piVar7;
  long lVar8;
  
  uVar1 = c;
  if (c < 1) {
    uVar1 = -c;
  }
  if (0x3b9b1848 < uVar1) goto LAB_00103a51;
  if (c == -0xb) {
    return 7;
  }
  piVar7 = conv_mcnp6_to_pdg_0to36;
  uVar5 = 0;
  do {
    if (*piVar7 == c) goto LAB_00103a47;
    uVar5 = uVar5 + 2;
    piVar7 = piVar7 + 1;
  } while (uVar5 != 0x4a);
  uVar5 = 1;
  lVar8 = 0;
  do {
    if (*(uint *)((long)conv_mcnp6_to_pdg_0to36 + lVar8) == -c) goto LAB_00103a47;
    uVar3 = (int)uVar5 + 2;
    uVar5 = (ulong)uVar3;
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0x94);
  bVar2 = true;
LAB_00103a49:
  if (!bVar2) {
    return uVar3;
  }
LAB_00103a51:
  iVar4 = 0;
  if (uVar1 + 0xc46535ff < 0x989676) {
    uVar3 = uVar1 / 10 + (uVar1 / 10000) * -1000;
    iVar6 = uVar1 / 10000 + (uVar1 / 10000000) * -1000;
    if (iVar6 - 1U < uVar3) {
      iVar4 = iVar6 * 0x10000 + ((uVar1 % 10) * 0x800000 | (uint)c >> 0x1f | uVar3 * 0x80) + 0x4a;
    }
  }
  return iVar4;
LAB_00103a47:
  uVar3 = (uint)uVar5;
  bVar2 = false;
  goto LAB_00103a49;
}

Assistant:

int32_t conv_mcnp6_pdg2ssw( int32_t c )
{
  int32_t absc = c < 0 ? -c : c;
  if (absc <= 1000020040) {
    if (c==-11)
      return 7;//e+ is special case, pick 7 (anti e-) rather than 16 (straight e+)
    int i;
    for (i = 0; i<37; ++i) {
      if (conv_mcnp6_to_pdg_0to36[i]==c)
        return 2*i;
    }
    for (i = 0; i<37; ++i) {
      if (conv_mcnp6_to_pdg_0to36[i] == -c)
        return 1 + 2*i;
    }
  }
  if (absc>1000000000&&absc<=1009999990) {
    //Ions. PDG format for ions is 10LZZZAAAI, where L!=0 indicates strangeness
    //and I!=0 indicates exited nuclei. We only allow L=0 ions here.
    int32_t I = absc % 10;//isomer level
    absc/=10;
    int32_t A = absc%1000;
    absc/=1000;
    int32_t Z = absc % 1000;
    assert(absc/1000==100);//L=0 guaranteed by enclosing condition.
    if ( !A || !Z || Z>A )
      return 0;
    int32_t res = (c<0?1:0);
    res += 2*37;
    res += 128*A;
    res += 128*512*Z;
    res += 128*512*128*I;
    return res;
  }
  return 0;
}